

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetryoperation.cpp
# Opt level: O1

void __thiscall
CIF::Symmetry::setOperation
          (Symmetry *this,int i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *factors)

{
  SymmetryOperation temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  SymmetryOperation local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,factors);
  SymmetryOperation::SymmetryOperation(&local_38,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  if (i != 0) {
    if (i == 1) {
      this = (Symmetry *)&this->yOperation;
    }
    else {
      if (i != 2) {
        return;
      }
      this = (Symmetry *)&this->zOperation;
    }
  }
  (this->xOperation).zf = local_38.zf;
  (this->xOperation).c = local_38.c;
  (this->xOperation).xf = local_38.xf;
  (this->xOperation).yf = local_38.yf;
  return;
}

Assistant:

void Symmetry::setOperation(int i, std::vector<std::string> factors) {
        SymmetryOperation temp = SymmetryOperation(factors);

        if (i == 0)
            xOperation = temp;
        else if (i == 1)
            yOperation = temp;
        else if (i == 2)
            zOperation = temp;
        // TODO: else statement with error handling
    }